

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

void __thiscall cmNinjaTargetGenerator::WriteCompileRule(cmNinjaTargetGenerator *this,string *lang)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmLocalNinjaGenerator *pcVar3;
  cmGeneratorTarget *pcVar4;
  cmNinjaTargetGenerator *this_00;
  size_type sVar5;
  undefined8 uVar6;
  pointer pbVar7;
  bool bVar8;
  TargetType targetType;
  int iVar9;
  string *psVar10;
  long *plVar11;
  undefined4 extraout_var;
  char *pcVar12;
  cmGlobalNinjaGenerator *pcVar13;
  char *__s;
  char *__s_00;
  char *__s_01;
  size_t sVar14;
  string *psVar15;
  size_type *psVar16;
  ulong *puVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  cmOutputConverter *pcVar18;
  pointer pcVar19;
  string *i;
  pointer __rhs_00;
  string ppVar;
  string compilerLauncher;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ppCmds;
  string cpplint_prop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  string run_iwyu;
  string cppcheck_prop;
  string responseFlag;
  string flags;
  cmNinjaRule rule;
  string cmakeCmd;
  string launcher;
  string tdi;
  string cldeps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  cmNinjaTargetGenerator *local_5d8;
  string *local_5d0;
  string local_5c8;
  undefined1 local_5a8 [40];
  cmMakefile *local_580;
  string local_578;
  string local_558;
  undefined1 local_538 [40];
  string local_510;
  cmRulePlaceholderExpander *local_4f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e8;
  int local_4c8;
  int local_4c4;
  long *local_4c0 [2];
  long local_4b0 [2];
  string local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  long *local_460;
  long local_458;
  long local_450 [2];
  undefined1 local_440 [32];
  _Alloc_hider local_420;
  size_type local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  _Alloc_hider local_400;
  char *local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  _Alloc_hider local_3e0;
  char *local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  _Alloc_hider local_3c0;
  char *local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  _Alloc_hider local_3a0;
  char *local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  _Alloc_hider local_360;
  char *local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  _Alloc_hider local_340;
  size_type local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  bool local_320;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  string local_2d8;
  undefined1 local_2b8 [48];
  pointer local_288;
  char *local_268;
  char *local_258;
  char *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  char *local_1f0;
  char *pcStack_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  string local_1a8;
  string local_188;
  string local_168;
  RuleVariables local_148;
  
  cmRulePlaceholderExpander::RuleVariables::RuleVariables(&local_148);
  psVar10 = cmGeneratorTarget::GetName_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_148.CMTargetName = (psVar10->_M_dataplus)._M_p;
  targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_148.CMTargetType = cmState::GetTargetTypeName(targetType);
  local_148.Language = (lang->_M_dataplus)._M_p;
  local_148.Source = "$in";
  local_148.Object = "$out";
  local_148.Defines = "$DEFINES";
  local_148.Includes = "$INCLUDES";
  local_148.TargetPDB = "$TARGET_PDB";
  local_148.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  local_148.ObjectDir = "$OBJECT_DIR";
  local_148.ObjectFileDir = "$OBJECT_FILE_DIR";
  local_4c4 = std::__cxx11::string::compare((char *)lang);
  local_4c8 = std::__cxx11::string::compare((char *)lang);
  local_580 = (this->super_cmCommonTargetGenerator).Makefile;
  local_460 = local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"$FLAGS","");
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  local_480._M_string_length = 0;
  local_480.field_2._M_local_buf[0] = '\0';
  iVar9 = std::__cxx11::string::compare((char *)lang);
  local_5d8 = this;
  local_5d0 = lang;
  if ((iVar9 != 0) && (bVar8 = ForceResponseFile(this), bVar8)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                   "CMAKE_",lang);
    plVar11 = (long *)std::__cxx11::string::append(local_2b8);
    psVar16 = (size_type *)(plVar11 + 2);
    if ((size_type *)*plVar11 == psVar16) {
      local_440._16_8_ = *psVar16;
      local_440._24_8_ = plVar11[3];
      local_440._0_8_ = local_440 + 0x10;
    }
    else {
      local_440._16_8_ = *psVar16;
      local_440._0_8_ = (size_type *)*plVar11;
    }
    local_440._8_8_ = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
      operator_delete((void *)local_2b8._0_8_,CONCAT71(local_2b8._17_7_,local_2b8[0x10]) + 1);
    }
    cmMakefile::GetSafeDefinition
              ((local_5d8->super_cmCommonTargetGenerator).Makefile,(string *)local_440);
    std::__cxx11::string::_M_assign((string *)&local_480);
    if (((char *)local_480._M_string_length == (char *)0x0) &&
       (iVar9 = std::__cxx11::string::compare((char *)local_5d0), iVar9 != 0)) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_480,0,(char *)local_480._M_string_length,0x56d1c8);
    }
    lang = local_5d0;
    if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
      operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
      lang = local_5d0;
    }
  }
  this_00 = local_5d8;
  iVar9 = (*(local_5d8->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
            _vptr_cmLocalGenerator[5])();
  local_4f0 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar9);
  pcVar3 = this_00->LocalGenerator;
  GetTargetDependInfoPath((string *)local_2b8,this_00,lang);
  ConvertToNinjaPath((string *)local_440,this_00,(string *)local_2b8);
  cmOutputConverter::ConvertToOutputFormat
            (&local_2d8,
             &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             (string *)local_440,SHELL);
  if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
    operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
  }
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_,CONCAT71(local_2b8._17_7_,local_2b8[0x10]) + 1);
  }
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  pcVar4 = (local_5d8->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar3 = local_5d8->LocalGenerator;
  local_440._0_8_ = local_440 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"RULE_LAUNCH_COMPILE","");
  pcVar12 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar3,pcVar4,(string *)local_440)
  ;
  if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
    operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
  }
  sVar5 = local_2f8._M_string_length;
  if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
    strlen(pcVar12);
    std::__cxx11::string::_M_replace((ulong)&local_2f8,0,(char *)sVar5,(ulong)pcVar12);
    std::__cxx11::string::append((char *)&local_2f8);
  }
  pcVar3 = local_5d8->LocalGenerator;
  psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  cmOutputConverter::ConvertToOutputFormat
            (&local_318,
             &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             psVar10,SHELL);
  psVar10 = local_5d0;
  if (local_4c4 == 0) {
    LanguagePreprocessRule(&local_168,local_5d8,local_5d0);
    local_440._0_8_ = local_440 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p == &local_168.field_2) {
      local_440._24_8_ = local_168.field_2._8_8_;
    }
    else {
      local_440._0_8_ = local_168._M_dataplus._M_p;
    }
    local_440._17_7_ = local_168.field_2._M_allocated_capacity._1_7_;
    local_440[0x10] = local_168.field_2._M_local_buf[0];
    local_420._M_p = (pointer)&local_410;
    local_440._8_8_ = local_168._M_string_length;
    local_168._M_string_length = 0;
    local_168.field_2._M_local_buf[0] = '\0';
    local_418 = 0;
    local_410._M_local_buf[0] = '\0';
    local_400._M_p = (pointer)&local_3f0;
    local_3f8 = (char *)0x0;
    local_3f0._M_local_buf[0] = '\0';
    local_3e0._M_p = (pointer)&local_3d0;
    local_3d8 = (char *)0x0;
    local_3d0._M_local_buf[0] = '\0';
    local_3c0._M_p = (pointer)&local_3b0;
    local_3b8 = (char *)0x0;
    local_3b0._M_local_buf[0] = '\0';
    local_3a0._M_p = (pointer)&local_390;
    local_398 = (char *)0x0;
    local_390._M_local_buf[0] = '\0';
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    local_380._M_string_length = 0;
    local_380.field_2._M_local_buf[0] = '\0';
    local_360._M_p = (pointer)&local_350;
    local_358 = (char *)0x0;
    local_350._M_local_buf[0] = '\0';
    local_340._M_p = (pointer)&local_330;
    local_338 = 0;
    local_330._M_local_buf[0] = '\0';
    local_320 = false;
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_replace((ulong)&local_3a0,0,(char *)0x0,0x54faae);
    std::__cxx11::string::_M_replace((ulong)&local_3c0,0,local_3b8,0x52d6b7);
    cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)local_2b8);
    local_2b8._0_8_ = local_148.CMTargetName;
    local_2b8._8_8_ = local_148.CMTargetType;
    local_288 = local_148.Language;
    local_248 = "$out";
    local_258 = "$out";
    local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._M_p;
    local_268 = local_148.Source;
    local_148.Source = "$in";
    local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5c8,local_460,(long)local_460 + local_458);
    local_1f0 = local_148.Defines;
    local_148.Defines = "";
    pcStack_1e8 = local_148.Includes;
    if ((char *)local_480._M_string_length != (char *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_380,0,(char *)local_380._M_string_length,0x52d66a);
      std::__cxx11::string::_M_replace((ulong)&local_360,0,local_358,0x52c1bf);
      std::__cxx11::string::append((char *)&local_360);
      std::__cxx11::string::append((char *)&local_360);
      std::__cxx11::string::append((char *)&local_360);
      std::__cxx11::string::append((char *)&local_360);
      std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_5c8._M_dataplus._M_p);
      std::operator+(&local_5f8,&local_480,&local_380);
      std::__cxx11::string::operator=((string *)&local_5c8,(string *)&local_5f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
      }
      local_1f0 = "";
      pcStack_1e8 = "";
    }
    local_230 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5c8._M_dataplus._M_p;
    local_5a8._0_8_ = (string *)0x0;
    local_5a8._8_8_ = (string *)0x0;
    local_5a8._16_8_ = (pointer)0x0;
    std::operator+(&local_5f8,"CMAKE_",psVar10);
    std::__cxx11::string::append((char *)&local_5f8);
    psVar10 = cmMakefile::GetRequiredDefinition
                        ((local_5d8->super_cmCommonTargetGenerator).Makefile,&local_5f8);
    cmSystemTools::ExpandListArgument
              (psVar10,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_5a8,false);
    paVar1 = &local_5f8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
    uVar6 = local_5a8._8_8_;
    if (local_5a8._0_8_ != local_5a8._8_8_) {
      psVar10 = (string *)local_5a8._0_8_;
      do {
        std::operator+(&local_5f8,&local_2f8,psVar10);
        std::__cxx11::string::operator=((string *)psVar10,(string *)&local_5f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != paVar1) {
          operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
        }
        pcVar18 = &(local_5d8->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter;
        if (local_5d8->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
          pcVar18 = (cmOutputConverter *)0x0;
        }
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (local_4f0,pcVar18,psVar10,(RuleVariables *)local_2b8);
        psVar10 = psVar10 + 1;
      } while (psVar10 != (string *)uVar6);
    }
    local_5f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5f8,local_318._M_dataplus._M_p,
               local_318._M_dataplus._M_p + local_318._M_string_length);
    std::__cxx11::string::append((char *)&local_5f8);
    std::__cxx11::string::_M_append((char *)&local_5f8,(ulong)local_2d8._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_5f8);
    std::__cxx11::string::_M_append((char *)&local_5f8,(ulong)(local_5d0->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_5f8);
    if (local_4c8 == 0) {
      std::__cxx11::string::append((char *)&local_5f8);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_5a8,
               &local_5f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
    local_558._M_string_length = 0;
    local_558.field_2._M_local_buf[0] = '\0';
    local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_5f8,local_5d8->LocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_5a8,&local_558,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&local_420,(string *)&local_5f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != &local_558.field_2) {
      operator_delete(local_558._M_dataplus._M_p,
                      CONCAT71(local_558.field_2._M_allocated_capacity._1_7_,
                               local_558.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::_M_replace((ulong)&local_3e0,0,local_3d8,0x52d6f2);
    std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)(local_5d0->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_3e0);
    std::__cxx11::string::_M_replace((ulong)&local_400,0,local_3f8,0x52d70a);
    std::__cxx11::string::_M_append((char *)&local_400,(ulong)(local_5d0->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_400);
    pcVar13 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(local_5d8->LocalGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar13,(cmNinjaRule *)local_440);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_5a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
      operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
    }
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_440);
  }
  if (local_4c8 == 0) {
    LanguageDyndepRule(&local_188,local_5d8,local_5d0);
    local_440._0_8_ = local_440 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p == &local_188.field_2) {
      local_440._24_8_ = local_188.field_2._8_8_;
    }
    else {
      local_440._0_8_ = local_188._M_dataplus._M_p;
    }
    local_440._17_7_ = local_188.field_2._M_allocated_capacity._1_7_;
    local_440[0x10] = local_188.field_2._M_local_buf[0];
    local_420._M_p = (pointer)&local_410;
    local_440._8_8_ = local_188._M_string_length;
    local_188._M_string_length = 0;
    local_188.field_2._M_local_buf[0] = '\0';
    local_418 = 0;
    local_410._M_local_buf[0] = '\0';
    local_400._M_p = (pointer)&local_3f0;
    local_3f8 = (char *)0x0;
    local_3f0._M_local_buf[0] = '\0';
    local_3e0._M_p = (pointer)&local_3d0;
    local_3d8 = (char *)0x0;
    local_3d0._M_local_buf[0] = '\0';
    local_3c0._M_p = (pointer)&local_3b0;
    local_3b8 = (char *)0x0;
    local_3b0._M_local_buf[0] = '\0';
    local_3a0._M_p = (pointer)&local_390;
    local_398 = (char *)0x0;
    local_390._M_local_buf[0] = '\0';
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    local_380._M_string_length = 0;
    local_380.field_2._M_local_buf[0] = '\0';
    local_360._M_p = (pointer)&local_350;
    local_358 = (char *)0x0;
    local_350._M_local_buf[0] = '\0';
    local_340._M_p = (pointer)&local_330;
    local_338 = 0;
    local_330._M_local_buf[0] = '\0';
    local_320 = false;
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_replace((ulong)&local_380,0,(char *)0x0,0x52d727);
    std::__cxx11::string::_M_replace((ulong)&local_360,0,local_358,0x52d8fe);
    local_5f8._M_dataplus._M_p = (pointer)0x0;
    local_5f8._M_string_length = 0;
    local_5f8.field_2._M_allocated_capacity = 0;
    local_2b8._0_8_ = local_2b8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2b8,local_318._M_dataplus._M_p,
               local_318._M_dataplus._M_p + local_318._M_string_length);
    std::__cxx11::string::append(local_2b8);
    std::__cxx11::string::_M_append(local_2b8,(ulong)local_2d8._M_dataplus._M_p);
    std::__cxx11::string::append(local_2b8);
    std::__cxx11::string::_M_append(local_2b8,(ulong)(local_5d0->_M_dataplus)._M_p);
    std::__cxx11::string::append(local_2b8);
    std::__cxx11::string::append(local_2b8);
    std::__cxx11::string::_M_append(local_2b8,(ulong)local_380._M_dataplus._M_p);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_5f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
    if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
      operator_delete((void *)local_2b8._0_8_,CONCAT71(local_2b8._17_7_,local_2b8[0x10]) + 1);
    }
    local_5c8._M_string_length = 0;
    local_5c8.field_2._M_allocated_capacity =
         local_5c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_2b8,local_5d8->LocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_5f8,&local_5c8,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&local_420,(string *)local_2b8);
    if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
      operator_delete((void *)local_2b8._0_8_,CONCAT71(local_2b8._17_7_,local_2b8[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
      operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_5f8);
    std::__cxx11::string::_M_replace((ulong)&local_3e0,0,local_3d8,0x52d75a);
    std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)(local_5d0->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_3e0);
    std::__cxx11::string::_M_replace((ulong)&local_400,0,local_3f8,0x52d783);
    std::__cxx11::string::_M_append((char *)&local_400,(ulong)(local_5d0->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_400);
    pcVar13 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(local_5d8->LocalGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar13,(cmNinjaRule *)local_440);
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_440);
  }
  pcVar19 = local_2b8 + 0x10;
  LanguageCompilerRule(&local_1a8,local_5d8,local_5d0);
  local_440._0_8_ = local_440 + 0x10;
  paVar1 = &local_1a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p == paVar1) {
    local_440._24_8_ = local_1a8.field_2._8_8_;
  }
  else {
    local_440._0_8_ = local_1a8._M_dataplus._M_p;
  }
  local_420._M_p = (pointer)&local_410;
  local_440._8_8_ = local_1a8._M_string_length;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_local_buf[0] = '\0';
  local_418 = 0;
  local_410._M_local_buf[0] = '\0';
  local_400._M_p = (pointer)&local_3f0;
  local_3f8 = (char *)0x0;
  local_3f0._M_local_buf[0] = '\0';
  local_3e0._M_p = (pointer)&local_3d0;
  local_3d8 = (char *)0x0;
  local_3d0._M_local_buf[0] = '\0';
  local_3c0._M_p = (pointer)&local_3b0;
  local_3b8 = (char *)0x0;
  local_3b0._M_local_buf[0] = '\0';
  local_3a0._M_p = (pointer)&local_390;
  local_398 = (char *)0x0;
  local_390._M_local_buf[0] = '\0';
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  local_380._M_string_length = 0;
  local_380.field_2._M_local_buf[0] = '\0';
  local_360._M_p = (pointer)&local_350;
  local_358 = (char *)0x0;
  local_350._M_local_buf[0] = '\0';
  local_340._M_p = (pointer)&local_330;
  local_338 = 0;
  local_330._M_local_buf[0] = '\0';
  local_320 = false;
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  if ((char *)local_480._M_string_length != (char *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_380,0,(char *)0x0,0x52d66a);
    std::__cxx11::string::_M_replace((ulong)&local_360,0,local_358,0x52c1bf);
    std::__cxx11::string::append((char *)&local_360);
    std::__cxx11::string::append((char *)&local_360);
    std::__cxx11::string::append((char *)&local_360);
    std::__cxx11::string::append((char *)&local_360);
    std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_460);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                   &local_480,&local_380);
    std::__cxx11::string::operator=((string *)&local_460,(string *)local_2b8);
    if ((pointer)local_2b8._0_8_ != pcVar19) {
      operator_delete((void *)local_2b8._0_8_,CONCAT71(local_2b8._17_7_,local_2b8[0x10]) + 1);
    }
    local_148.Defines = "";
    local_148.Includes = "";
  }
  __rhs = local_5d0;
  local_2b8._8_8_ = (char *)0x0;
  local_2b8[0x10] = '\0';
  local_2b8._0_8_ = pcVar19;
  if (local_4c4 != 0) {
    bVar8 = NeedDepTypeMSVC(local_5d8,local_5d0);
    if (bVar8) {
      std::__cxx11::string::_M_replace((ulong)&local_3a0,0,local_398,0x52d48d);
      local_3b8 = (char *)0x0;
      *local_3c0._M_p = '\0';
      std::__cxx11::string::append((char *)&local_460);
    }
    else {
      std::operator+(&local_5c8,"CMAKE_NINJA_CMCLDEPS_",__rhs);
      bVar8 = cmMakefile::IsOn(local_580,&local_5c8);
      paVar1 = &local_5c8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
      }
      if (bVar8) {
        bVar8 = cmMakefile::GetIsSourceFileTryCompile(local_580);
        if (bVar8) goto LAB_00275300;
        std::__cxx11::string::_M_replace((ulong)&local_3a0,0,local_398,0x52d7c6);
        std::__cxx11::string::_M_replace((ulong)&local_3c0,0,local_3b8,0x52d6b7);
        paVar2 = &local_5f8.field_2;
        local_5f8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"CMAKE_C_COMPILER","");
        pcVar12 = cmMakefile::GetDefinition(local_580,&local_5f8);
        local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
        if (pcVar12 == (char *)0x0) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_558,"CMAKE_CXX_COMPILER","");
          psVar10 = cmMakefile::GetSafeDefinition(local_580,&local_558);
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_558,"CMAKE_C_COMPILER","");
          psVar10 = cmMakefile::GetSafeDefinition(local_580,&local_558);
        }
        pcVar19 = (psVar10->_M_dataplus)._M_p;
        local_5c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_5c8,pcVar19,pcVar19 + psVar10->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._M_dataplus._M_p != &local_558.field_2) {
          operator_delete(local_558._M_dataplus._M_p,
                          CONCAT71(local_558.field_2._M_allocated_capacity._1_7_,
                                   local_558.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != paVar2) {
          operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_replace((ulong)local_2b8,0,(char *)local_2b8._8_8_,0x535ac4);
        psVar10 = cmSystemTools::GetCMClDepsCommand_abi_cxx11_();
        std::__cxx11::string::_M_append(local_2b8,(ulong)(psVar10->_M_dataplus)._M_p);
        std::operator+(&local_4a0,"\" ",__rhs);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_4a0);
        psVar10 = (string *)(plVar11 + 2);
        if ((string *)*plVar11 == psVar10) {
          local_538._16_8_ = (psVar10->_M_dataplus)._M_p;
          local_538._24_8_ = plVar11[3];
          local_538._0_8_ = (string *)(local_538 + 0x10);
        }
        else {
          local_538._16_8_ = (psVar10->_M_dataplus)._M_p;
          local_538._0_8_ = (string *)*plVar11;
        }
        local_538._8_8_ = plVar11[1];
        *plVar11 = (long)psVar10;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append(local_538);
        psVar10 = (string *)(local_5a8 + 0x10);
        psVar15 = (string *)(plVar11 + 2);
        if ((string *)*plVar11 == psVar15) {
          local_5a8._16_8_ = (psVar15->_M_dataplus)._M_p;
          local_5a8._24_8_ = plVar11[3];
          local_5a8._0_8_ = psVar10;
        }
        else {
          local_5a8._16_8_ = (psVar15->_M_dataplus)._M_p;
          local_5a8._0_8_ = (string *)*plVar11;
        }
        local_5a8._8_8_ = plVar11[1];
        *plVar11 = (long)psVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append(local_5a8);
        psVar16 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_5f8.field_2._M_allocated_capacity = *psVar16;
          local_5f8.field_2._8_8_ = plVar11[3];
          local_5f8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_5f8.field_2._M_allocated_capacity = *psVar16;
          local_5f8._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_5f8._M_string_length = plVar11[1];
        *plVar11 = (long)psVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::_M_append(local_2b8,(ulong)local_5f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != paVar2) {
          operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
        }
        if ((string *)local_5a8._0_8_ != psVar10) {
          operator_delete((void *)local_5a8._0_8_,(ulong)(local_5a8._16_8_ + 1));
        }
        if ((string *)local_538._0_8_ != (string *)(local_538 + 0x10)) {
          operator_delete((void *)local_538._0_8_,(ulong)(local_538._16_8_ + 1));
        }
        __rhs = local_5d0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
        }
        local_5f8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_5f8,"CMAKE_CL_SHOWINCLUDES_PREFIX","");
        psVar15 = cmMakefile::GetSafeDefinition(local_580,&local_5f8);
        std::__cxx11::string::_M_append(local_2b8,(ulong)(psVar15->_M_dataplus)._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != paVar2) {
          operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5a8,"\" \"",&local_5c8);
        plVar11 = (long *)std::__cxx11::string::append(local_5a8);
        psVar16 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_5f8.field_2._M_allocated_capacity = *psVar16;
          local_5f8.field_2._8_8_ = plVar11[3];
          local_5f8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_5f8.field_2._M_allocated_capacity = *psVar16;
          local_5f8._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_5f8._M_string_length = plVar11[1];
        *plVar11 = (long)psVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::_M_append(local_2b8,(ulong)local_5f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != paVar2) {
          operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
        }
        if ((string *)local_5a8._0_8_ != psVar10) {
          operator_delete((void *)local_5a8._0_8_,(ulong)(local_5a8._16_8_ + 1));
        }
      }
      else {
        std::__cxx11::string::_M_replace((ulong)&local_3a0,0,local_398,0x52d7c6);
        std::__cxx11::string::_M_replace((ulong)&local_3c0,0,local_3b8,0x52d6b7);
        std::operator+(&local_5c8,"CMAKE_DEPFILE_FLAGS_",__rhs);
        psVar10 = cmMakefile::GetSafeDefinition(local_580,&local_5c8);
        pcVar19 = (psVar10->_M_dataplus)._M_p;
        local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_5f8,pcVar19,pcVar19 + psVar10->_M_string_length);
        if (local_5f8._M_string_length != 0) {
          cmsys::SystemTools::ReplaceString(&local_5f8,"<DEPFILE>","$DEP_FILE");
          cmsys::SystemTools::ReplaceString(&local_5f8,"<OBJECT>","$out");
          paVar2 = &local_558.field_2;
          local_558._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_558,"CMAKE_C_COMPILER","");
          pcVar12 = cmMakefile::GetDefinition(local_580,&local_558);
          cmsys::SystemTools::ReplaceString(&local_5f8,"<CMAKE_C_COMPILER>",pcVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_558._M_dataplus._M_p != paVar2) {
            operator_delete(local_558._M_dataplus._M_p,
                            CONCAT71(local_558.field_2._M_allocated_capacity._1_7_,
                                     local_558.field_2._M_local_buf[0]) + 1);
          }
          std::operator+(&local_558," ",&local_5f8);
          std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_558._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_558._M_dataplus._M_p != paVar2) {
            operator_delete(local_558._M_dataplus._M_p,
                            CONCAT71(local_558.field_2._M_allocated_capacity._1_7_,
                                     local_558.field_2._M_local_buf[0]) + 1);
          }
        }
        __rhs = local_5d0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
          operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
          __rhs = local_5d0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_00275300:
  local_148.Flags = (char *)local_460;
  local_148.DependencyFile = local_3c0._M_p;
  local_4e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_4e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_4e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar9 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar9 == 0) {
    local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
    local_5c8._M_string_length = 0;
    local_5c8.field_2._M_allocated_capacity =
         local_5c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pcVar4 = (local_5d8->super_cmCommonTargetGenerator).GeneratorTarget;
    paVar1 = &local_5f8.field_2;
    local_5f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5f8,"CUDA_SEPARABLE_COMPILATION","");
    bVar8 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,&local_5f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
    if (bVar8) {
      pcVar12 = "CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION";
    }
    else {
      pcVar4 = (local_5d8->super_cmCommonTargetGenerator).GeneratorTarget;
      local_5f8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_5f8,"CUDA_PTX_COMPILATION","");
      bVar8 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,&local_5f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
      }
      pcVar12 = "CMAKE_CUDA_COMPILE_WHOLE_COMPILATION";
      if (bVar8) {
        pcVar12 = "CMAKE_CUDA_COMPILE_PTX_COMPILATION";
      }
    }
    std::__cxx11::string::_M_replace
              ((ulong)&local_5c8,0,(char *)local_5c8._M_string_length,(ulong)pcVar12);
    psVar10 = cmMakefile::GetRequiredDefinition(local_580,&local_5c8);
    cmSystemTools::ExpandListArgument(psVar10,&local_4e8,false);
  }
  else {
    std::operator+(&local_5f8,"CMAKE_",__rhs);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_5f8);
    local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
    puVar17 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_5c8.field_2._M_allocated_capacity = *puVar17;
      local_5c8.field_2._8_8_ = plVar11[3];
    }
    else {
      local_5c8.field_2._M_allocated_capacity = *puVar17;
      local_5c8._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_5c8._M_string_length = plVar11[1];
    *plVar11 = (long)puVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
    psVar10 = cmMakefile::GetRequiredDefinition(local_580,&local_5c8);
    cmSystemTools::ExpandListArgument(psVar10,&local_4e8,false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  psVar10 = local_5d0;
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  local_5c8._M_string_length = 0;
  local_5c8.field_2._M_allocated_capacity =
       local_5c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((local_4e8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_4e8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((((iVar9 = std::__cxx11::string::compare((char *)local_5d0), iVar9 == 0 ||
        (iVar9 = std::__cxx11::string::compare((char *)psVar10), iVar9 == 0)) ||
       (iVar9 = std::__cxx11::string::compare((char *)psVar10), iVar9 == 0)) ||
      (iVar9 = std::__cxx11::string::compare((char *)psVar10), iVar9 == 0)))) {
    pcVar19 = (psVar10->_M_dataplus)._M_p;
    local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5f8,pcVar19,pcVar19 + psVar10->_M_string_length);
    std::__cxx11::string::append((char *)&local_5f8);
    pcVar12 = cmGeneratorTarget::GetProperty
                        ((local_5d8->super_cmCommonTargetGenerator).GeneratorTarget,&local_5f8);
    sVar5 = local_5c8._M_string_length;
    if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
      strlen(pcVar12);
      std::__cxx11::string::_M_replace((ulong)&local_5c8,0,(char *)sVar5,(ulong)pcVar12);
    }
    psVar10 = local_5d0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
      psVar10 = local_5d0;
    }
  }
  if ((local_4e8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_4e8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((iVar9 = std::__cxx11::string::compare((char *)psVar10), iVar9 == 0 ||
      (iVar9 = std::__cxx11::string::compare((char *)psVar10), iVar9 == 0)))) {
    local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
    pcVar19 = (psVar10->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5f8,pcVar19,pcVar19 + psVar10->_M_string_length);
    std::__cxx11::string::append((char *)&local_5f8);
    pcVar12 = cmGeneratorTarget::GetProperty
                        ((local_5d8->super_cmCommonTargetGenerator).GeneratorTarget,&local_5f8);
    local_5a8._0_8_ = local_5a8 + 0x10;
    pcVar19 = (psVar10->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_5a8,pcVar19,pcVar19 + psVar10->_M_string_length);
    std::__cxx11::string::append(local_5a8);
    __s = cmGeneratorTarget::GetProperty
                    ((local_5d8->super_cmCommonTargetGenerator).GeneratorTarget,(string *)local_5a8)
    ;
    local_538._0_8_ = local_538 + 0x10;
    pcVar19 = (psVar10->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_538,pcVar19,pcVar19 + psVar10->_M_string_length);
    std::__cxx11::string::append(local_538);
    __s_00 = cmGeneratorTarget::GetProperty
                       ((local_5d8->super_cmCommonTargetGenerator).GeneratorTarget,
                        (string *)local_538);
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    pcVar19 = (psVar10->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4a0,pcVar19,pcVar19 + psVar10->_M_string_length);
    std::__cxx11::string::append((char *)&local_4a0);
    __s_01 = cmGeneratorTarget::GetProperty
                       ((local_5d8->super_cmCommonTargetGenerator).GeneratorTarget,&local_4a0);
    if (((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) ||
       ((((__s != (char *)0x0 && (*__s != '\0')) || ((__s_00 != (char *)0x0 && (*__s_00 != '\0'))))
        || ((__s_01 != (char *)0x0 && (*__s_01 != '\0')))))) {
      local_4c0[0] = local_4b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4c0,local_318._M_dataplus._M_p,
                 local_318._M_dataplus._M_p + local_318._M_string_length);
      std::__cxx11::string::append((char *)local_4c0);
      if ((char *)local_5c8._M_string_length != (char *)0x0) {
        std::__cxx11::string::append((char *)local_4c0);
        cmOutputConverter::EscapeForShell
                  (&local_578,
                   &(local_5d8->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator
                    .super_cmOutputConverter,&local_5c8,false,false,false);
        std::__cxx11::string::_M_append((char *)local_4c0,(ulong)local_578._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        local_5c8._M_string_length = 0;
        *local_5c8._M_dataplus._M_p = '\0';
      }
      if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
        std::__cxx11::string::append((char *)local_4c0);
        pcVar3 = local_5d8->LocalGenerator;
        local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
        sVar14 = strlen(pcVar12);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_510,pcVar12,pcVar12 + sVar14);
        cmOutputConverter::EscapeForShell
                  (&local_578,
                   &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_510,false,false,false);
        std::__cxx11::string::_M_append((char *)local_4c0,(ulong)local_578._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
        }
      }
      if ((__s != (char *)0x0) && (*__s != '\0')) {
        std::__cxx11::string::append((char *)local_4c0);
        pcVar3 = local_5d8->LocalGenerator;
        local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
        sVar14 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,__s,__s + sVar14);
        cmOutputConverter::EscapeForShell
                  (&local_578,
                   &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_510,false,false,false);
        std::__cxx11::string::_M_append((char *)local_4c0,(ulong)local_578._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
        }
      }
      if ((__s_00 != (char *)0x0) && (*__s_00 != '\0')) {
        std::__cxx11::string::append((char *)local_4c0);
        pcVar3 = local_5d8->LocalGenerator;
        local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
        sVar14 = strlen(__s_00);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,__s_00,__s_00 + sVar14)
        ;
        cmOutputConverter::EscapeForShell
                  (&local_578,
                   &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_510,false,false,false);
        std::__cxx11::string::_M_append((char *)local_4c0,(ulong)local_578._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
        }
      }
      if ((__s_01 != (char *)0x0) && (*__s_01 != '\0')) {
        std::__cxx11::string::append((char *)local_4c0);
        pcVar3 = local_5d8->LocalGenerator;
        local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
        sVar14 = strlen(__s_01);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,__s_01,__s_01 + sVar14)
        ;
        cmOutputConverter::EscapeForShell
                  (&local_578,
                   &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_510,false,false,false);
        std::__cxx11::string::_M_append((char *)local_4c0,(ulong)local_578._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510._M_dataplus._M_p != &local_510.field_2) {
          operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
        }
      }
      if ((((__s != (char *)0x0) && (*__s != '\0')) ||
          ((__s_00 != (char *)0x0 && (*__s_00 != '\0')))) ||
         ((__s_01 != (char *)0x0 && (*__s_01 != '\0')))) {
        std::__cxx11::string::append((char *)local_4c0);
      }
      std::__cxx11::string::append((char *)local_4c0);
      std::__cxx11::string::replace
                ((ulong)local_4e8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,0,(char *)0x0,(ulong)local_4c0[0])
      ;
      if (local_4c0[0] != local_4b0) {
        operator_delete(local_4c0[0],local_4b0[0] + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    if ((string *)local_538._0_8_ != (string *)(local_538 + 0x10)) {
      operator_delete((void *)local_538._0_8_,(ulong)(local_538._16_8_ + 1));
    }
    if ((string *)local_5a8._0_8_ != (string *)(local_5a8 + 0x10)) {
      operator_delete((void *)local_5a8._0_8_,(ulong)(local_5a8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((local_4e8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_4e8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((char *)local_5c8._M_string_length != (char *)0x0)) {
    local_538._0_8_ = (string *)0x0;
    local_538._8_8_ = (string *)0x0;
    local_538._16_8_ = (pointer)0x0;
    cmSystemTools::ExpandListArgument
              (&local_5c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_538,true);
    if (local_538._0_8_ != local_538._8_8_) {
      cmOutputConverter::ConvertToOutputFormat
                (&local_5f8,
                 &(local_5d8->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)local_538._0_8_,SHELL);
      std::__cxx11::string::operator=((string *)local_538._0_8_,(string *)&local_5f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
      }
      uVar6 = local_538._8_8_;
      for (psVar10 = (string *)(local_538._0_8_ + 0x20); psVar10 != (string *)uVar6;
          psVar10 = psVar10 + 1) {
        cmOutputConverter::EscapeForShell
                  (&local_5f8,
                   &(local_5d8->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator
                    .super_cmOutputConverter,psVar10,false,false,false);
        std::__cxx11::string::operator=((string *)psVar10,(string *)&local_5f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
          operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
        }
      }
    }
    pbVar7 = local_4e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_5a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_538," ");
    plVar11 = (long *)std::__cxx11::string::append(local_5a8);
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_5f8.field_2._M_allocated_capacity = *psVar16;
      local_5f8.field_2._8_8_ = plVar11[3];
      local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
    }
    else {
      local_5f8.field_2._M_allocated_capacity = *psVar16;
      local_5f8._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_5f8._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::replace((ulong)pbVar7,0,(char *)0x0,(ulong)local_5f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
    if ((string *)local_5a8._0_8_ != (string *)(local_5a8 + 0x10)) {
      operator_delete((void *)local_5a8._0_8_,(ulong)(local_5a8._16_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_538);
  }
  if (local_4e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::replace
              ((ulong)local_4e8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,0,(char *)0x0,local_2b8._0_8_);
  }
  pbVar7 = local_4e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_4e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __rhs_00 = local_4e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::operator+(&local_5f8,&local_2f8,__rhs_00);
      std::__cxx11::string::operator=((string *)__rhs_00,(string *)&local_5f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
        operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
      }
      pcVar18 = &(local_5d8->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
      if (local_5d8->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
        pcVar18 = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables(local_4f0,pcVar18,__rhs_00,&local_148);
      __rhs_00 = __rhs_00 + 1;
    } while (__rhs_00 != pbVar7);
  }
  local_5a8._8_8_ = (pointer)0x0;
  local_5a8._16_8_ = local_5a8._16_8_ & 0xffffffffffffff00;
  local_5a8._0_8_ = (pointer)(local_5a8 + 0x10);
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_5f8,local_5d8->LocalGenerator,&local_4e8,(string *)local_5a8,
             (cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&local_420,(string *)&local_5f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_5a8._0_8_ != (pointer)(local_5a8 + 0x10)) {
    operator_delete((void *)local_5a8._0_8_,(ulong)(local_5a8._16_8_ + 1));
  }
  std::__cxx11::string::_M_replace((ulong)&local_3e0,0,local_3d8,0x52d907);
  psVar10 = local_5d0;
  std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)(local_5d0->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&local_3e0);
  std::__cxx11::string::_M_replace((ulong)&local_400,0,local_3f8,0x52d70a);
  std::__cxx11::string::_M_append((char *)&local_400,(ulong)(psVar10->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&local_400);
  pcVar13 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(local_5d8->LocalGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar13,(cmNinjaRule *)local_440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4e8);
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_,CONCAT71(local_2b8._17_7_,local_2b8[0x10]) + 1);
  }
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,
                    CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                             local_2f8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (local_4f0 != (cmRulePlaceholderExpander *)0x0) {
    std::default_delete<cmRulePlaceholderExpander>::operator()
              ((default_delete<cmRulePlaceholderExpander> *)&local_4f0,local_4f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,
                    CONCAT71(local_480.field_2._M_allocated_capacity._1_7_,
                             local_480.field_2._M_local_buf[0]) + 1);
  }
  if (local_460 != local_450) {
    operator_delete(local_460,local_450[0] + 1);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteCompileRule(const std::string& lang)
{
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());
  vars.Language = lang.c_str();
  vars.Source = "$in";
  vars.Object = "$out";
  vars.Defines = "$DEFINES";
  vars.Includes = "$INCLUDES";
  vars.TargetPDB = "$TARGET_PDB";
  vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  vars.ObjectDir = "$OBJECT_DIR";
  vars.ObjectFileDir = "$OBJECT_FILE_DIR";

  // For some cases we do an explicit preprocessor invocation.
  bool const explicitPP = this->NeedExplicitPreprocessing(lang);
  bool const needDyndep = this->NeedDyndep(lang);

  cmMakefile* mf = this->GetMakefile();

  std::string flags = "$FLAGS";

  std::string responseFlag;
  bool const lang_supports_response = lang != "RC";
  if (lang_supports_response && this->ForceResponseFile()) {
    std::string const responseFlagVar =
      "CMAKE_" + lang + "_RESPONSE_FILE_FLAG";
    responseFlag = this->Makefile->GetSafeDefinition(responseFlagVar);
    if (responseFlag.empty() && lang != "CUDA") {
      responseFlag = "@";
    }
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  std::string const tdi = this->GetLocalGenerator()->ConvertToOutputFormat(
    ConvertToNinjaPath(this->GetTargetDependInfoPath(lang)),
    cmLocalGenerator::SHELL);

  std::string launcher;
  const char* val = this->GetLocalGenerator()->GetRuleLauncher(
    this->GetGeneratorTarget(), "RULE_LAUNCH_COMPILE");
  if (val && *val) {
    launcher = val;
    launcher += " ";
  }

  std::string const cmakeCmd =
    this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);

  if (explicitPP) {
    cmNinjaRule rule(this->LanguagePreprocessRule(lang));
    // Explicit preprocessing always uses a depfile.
    rule.DepType = ""; // no deps= for multiple outputs
    rule.DepFile = "$DEP_FILE";

    cmRulePlaceholderExpander::RuleVariables ppVars;
    ppVars.CMTargetName = vars.CMTargetName;
    ppVars.CMTargetType = vars.CMTargetType;
    ppVars.Language = vars.Language;
    ppVars.Object = "$out"; // for RULE_LAUNCH_COMPILE
    ppVars.PreprocessedSource = "$out";
    ppVars.DependencyFile = rule.DepFile.c_str();

    // Preprocessing uses the original source,
    // compilation uses preprocessed output.
    ppVars.Source = vars.Source;
    vars.Source = "$in";

    // Preprocessing and compilation use the same flags.
    std::string ppFlags = flags;

    // Move preprocessor definitions to the preprocessor rule.
    ppVars.Defines = vars.Defines;
    vars.Defines = "";

    // Copy include directories to the preprocessor rule.  The Fortran
    // compilation rule still needs them for the INCLUDE directive.
    ppVars.Includes = vars.Includes;

    // If using a response file, move defines, includes, and flags into it.
    if (!responseFlag.empty()) {
      rule.RspFile = "$RSP_FILE";
      rule.RspContent = " ";
      rule.RspContent += ppVars.Defines;
      rule.RspContent += " ";
      rule.RspContent += ppVars.Includes;
      rule.RspContent += " ";
      rule.RspContent += ppFlags;
      ppFlags = responseFlag + rule.RspFile;
      ppVars.Defines = "";
      ppVars.Includes = "";
    }

    ppVars.Flags = ppFlags.c_str();

    // Rule for preprocessing source file.
    std::vector<std::string> ppCmds;
    {
      // Lookup the explicit preprocessing rule.
      std::string ppVar = "CMAKE_" + lang;
      ppVar += "_PREPROCESS_SOURCE";
      cmSystemTools::ExpandListArgument(
        this->GetMakefile()->GetRequiredDefinition(ppVar), ppCmds);
    }

    for (std::string& i : ppCmds) {
      i = launcher + i;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   i, ppVars);
    }

    // Run CMake dependency scanner on preprocessed output.
    {
      std::string ccmd = cmakeCmd;
      ccmd += " -E cmake_ninja_depends --tdi=";
      ccmd += tdi;
      ccmd += " --lang=";
      ccmd += lang;
      ccmd += " --pp=$out --dep=$DEP_FILE";
      if (needDyndep) {
        ccmd += " --obj=$OBJ_FILE --ddi=$DYNDEP_INTERMEDIATE_FILE";
      }
      ppCmds.emplace_back(std::move(ccmd));
    }
    rule.Command = this->GetLocalGenerator()->BuildCommandLine(ppCmds);

    // Write the rule for preprocessing file of the given language.
    rule.Comment = "Rule for preprocessing ";
    rule.Comment += lang;
    rule.Comment += " files.";
    rule.Description = "Building ";
    rule.Description += lang;
    rule.Description += " preprocessed $out";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  if (needDyndep) {
    // Write the rule for ninja dyndep file generation.
    cmNinjaRule rule(this->LanguageDyndepRule(lang));
    // Command line length is almost always limited -> use response file for
    // dyndep rules
    rule.RspFile = "$out.rsp";
    rule.RspContent = "$in";

    // Run CMake dependency scanner on the source file (using the preprocessed
    // source if that was performed).
    {
      std::vector<std::string> ddCmds;
      {
        std::string ccmd = cmakeCmd;
        ccmd += " -E cmake_ninja_dyndep --tdi=";
        ccmd += tdi;
        ccmd += " --lang=";
        ccmd += lang;
        ccmd += " --dd=$out ";
        ccmd += "@";
        ccmd += rule.RspFile;
        ddCmds.emplace_back(std::move(ccmd));
      }
      rule.Command = this->GetLocalGenerator()->BuildCommandLine(ddCmds);
    }
    rule.Comment = "Rule to generate ninja dyndep files for ";
    rule.Comment += lang;
    rule.Comment += ".";
    rule.Description = "Generating ";
    rule.Description += lang;
    rule.Description += " dyndep file $out";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  cmNinjaRule rule(this->LanguageCompilerRule(lang));
  // If using a response file, move defines, includes, and flags into it.
  if (!responseFlag.empty()) {
    rule.RspFile = "$RSP_FILE";
    rule.RspContent = " ";
    rule.RspContent += vars.Defines;
    rule.RspContent += " ";
    rule.RspContent += vars.Includes;
    rule.RspContent += " ";
    rule.RspContent += flags;
    flags = responseFlag + rule.RspFile;
    vars.Defines = "";
    vars.Includes = "";
  }

  // Tell ninja dependency format so all deps can be loaded into a database
  std::string cldeps;
  if (explicitPP) {
    // The explicit preprocessing step will handle dependency scanning.
  } else if (this->NeedDepTypeMSVC(lang)) {
    rule.DepType = "msvc";
    rule.DepFile.clear();
    flags += " /showIncludes";
  } else if (mf->IsOn("CMAKE_NINJA_CMCLDEPS_" + lang)) {
    // For the MS resource compiler we need cmcldeps, but skip dependencies
    // for source-file try_compile cases because they are always fresh.
    if (!mf->GetIsSourceFileTryCompile()) {
      rule.DepType = "gcc";
      rule.DepFile = "$DEP_FILE";
      const std::string cl = mf->GetDefinition("CMAKE_C_COMPILER")
        ? mf->GetSafeDefinition("CMAKE_C_COMPILER")
        : mf->GetSafeDefinition("CMAKE_CXX_COMPILER");
      cldeps = "\"";
      cldeps += cmSystemTools::GetCMClDepsCommand();
      cldeps += "\" " + lang + " " + vars.Source + " $DEP_FILE $out \"";
      cldeps += mf->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
      cldeps += "\" \"" + cl + "\" ";
    }
  } else {
    rule.DepType = "gcc";
    rule.DepFile = "$DEP_FILE";
    const std::string flagsName = "CMAKE_DEPFILE_FLAGS_" + lang;
    std::string depfileFlags = mf->GetSafeDefinition(flagsName);
    if (!depfileFlags.empty()) {
      cmSystemTools::ReplaceString(depfileFlags, "<DEPFILE>", "$DEP_FILE");
      cmSystemTools::ReplaceString(depfileFlags, "<OBJECT>", "$out");
      cmSystemTools::ReplaceString(depfileFlags, "<CMAKE_C_COMPILER>",
                                   mf->GetDefinition("CMAKE_C_COMPILER"));
      flags += " " + depfileFlags;
    }
  }

  vars.Flags = flags.c_str();
  vars.DependencyFile = rule.DepFile.c_str();

  // Rule for compiling object file.
  std::vector<std::string> compileCmds;
  if (lang == "CUDA") {
    std::string cmdVar;
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION";
    } else if (this->GeneratorTarget->GetPropertyAsBool(
                 "CUDA_PTX_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_PTX_COMPILATION";
    } else {
      cmdVar = "CMAKE_CUDA_COMPILE_WHOLE_COMPILATION";
    }
    const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  } else {
    const std::string cmdVar = "CMAKE_" + lang + "_COMPILE_OBJECT";
    const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  }

  // See if we need to use a compiler launcher like ccache or distcc
  std::string compilerLauncher;
  if (!compileCmds.empty() &&
      (lang == "C" || lang == "CXX" || lang == "Fortran" || lang == "CUDA")) {
    std::string const clauncher_prop = lang + "_COMPILER_LAUNCHER";
    const char* clauncher = this->GeneratorTarget->GetProperty(clauncher_prop);
    if (clauncher && *clauncher) {
      compilerLauncher = clauncher;
    }
  }

  // Maybe insert an include-what-you-use runner.
  if (!compileCmds.empty() && (lang == "C" || lang == "CXX")) {
    std::string const iwyu_prop = lang + "_INCLUDE_WHAT_YOU_USE";
    const char* iwyu = this->GeneratorTarget->GetProperty(iwyu_prop);
    std::string const tidy_prop = lang + "_CLANG_TIDY";
    const char* tidy = this->GeneratorTarget->GetProperty(tidy_prop);
    std::string const cpplint_prop = lang + "_CPPLINT";
    const char* cpplint = this->GeneratorTarget->GetProperty(cpplint_prop);
    std::string const cppcheck_prop = lang + "_CPPCHECK";
    const char* cppcheck = this->GeneratorTarget->GetProperty(cppcheck_prop);
    if ((iwyu && *iwyu) || (tidy && *tidy) || (cpplint && *cpplint) ||
        (cppcheck && *cppcheck)) {
      std::string run_iwyu = cmakeCmd;
      run_iwyu += " -E __run_co_compile";
      if (!compilerLauncher.empty()) {
        // In __run_co_compile case the launcher command is supplied
        // via --launcher=<maybe-list> and consumed
        run_iwyu += " --launcher=";
        run_iwyu += this->LocalGenerator->EscapeForShell(compilerLauncher);
        compilerLauncher.clear();
      }
      if (iwyu && *iwyu) {
        run_iwyu += " --iwyu=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(iwyu);
      }
      if (tidy && *tidy) {
        run_iwyu += " --tidy=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(tidy);
      }
      if (cpplint && *cpplint) {
        run_iwyu += " --cpplint=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cpplint);
      }
      if (cppcheck && *cppcheck) {
        run_iwyu += " --cppcheck=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cppcheck);
      }
      if ((tidy && *tidy) || (cpplint && *cpplint) ||
          (cppcheck && *cppcheck)) {
        run_iwyu += " --source=$in";
      }
      run_iwyu += " -- ";
      compileCmds.front().insert(0, run_iwyu);
    }
  }

  // If compiler launcher was specified and not consumed above, it
  // goes to the beginning of the command line.
  if (!compileCmds.empty() && !compilerLauncher.empty()) {
    std::vector<std::string> args;
    cmSystemTools::ExpandListArgument(compilerLauncher, args, true);
    if (!args.empty()) {
      args[0] = this->LocalGenerator->ConvertToOutputFormat(
        args[0], cmOutputConverter::SHELL);
      for (std::string& i : cmMakeRange(args.begin() + 1, args.end())) {
        i = this->LocalGenerator->EscapeForShell(i);
      }
    }
    compileCmds.front().insert(0, cmJoin(args, " ") + " ");
  }

  if (!compileCmds.empty()) {
    compileCmds.front().insert(0, cldeps);
  }

  for (std::string& i : compileCmds) {
    i = launcher + i;
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 vars);
  }

  rule.Command = this->GetLocalGenerator()->BuildCommandLine(compileCmds);

  // Write the rule for compiling file of the given language.
  rule.Comment = "Rule for compiling ";
  rule.Comment += lang;
  rule.Comment += " files.";
  rule.Description = "Building ";
  rule.Description += lang;
  rule.Description += " object $out";
  this->GetGlobalGenerator()->AddRule(rule);
}